

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod
          (ConversionStream *this,iterator *Token,iterator *ScopeStart,iterator *ScopeEnd)

{
  HLSL2GLSLConverterImpl *this_00;
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  Char *pCVar4;
  pointer pHVar5;
  HLSLObjectInfo *_Obj;
  char *pcVar6;
  pointer pHVar7;
  undefined8 uVar8;
  reference this_01;
  long lVar9;
  iterator *Args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  HLSLTokenInfo local_408;
  const_iterator local_3b8;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_3b0;
  iterator SwizzleToken;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  HLSLTokenInfo local_350;
  const_iterator local_300;
  _List_node_base *local_2f8;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  HLSLTokenInfo local_2a0;
  const_iterator local_250;
  _List_node_base *local_248;
  const_iterator local_240;
  const_iterator local_238;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  HLSLTokenInfo local_1e0;
  undefined1 local_190 [8];
  string _msg;
  allocator local_161;
  String local_160;
  FunctionStubHashKey local_140;
  _Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
  local_118;
  const_iterator StubIt;
  iterator iStack_108;
  Uint32 NumArguments;
  iterator ArgsListEndToken;
  iterator ArgsListStartToken;
  String *ObjectType;
  HLSLObjectInfo *pObjectInfo;
  undefined1 local_c8 [8];
  string err;
  _Self local_98;
  iterator IdentifierToken;
  string msg_1;
  iterator MethodToken;
  undefined1 local_58 [8];
  string msg;
  iterator DotToken;
  iterator *ScopeEnd_local;
  iterator *ScopeStart_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = Token->_M_node;
  Args_1 = ScopeEnd;
  bVar2 = std::operator!=((_Self *)((long)&msg.field_2 + 8),ScopeEnd);
  if (bVar2) {
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    bVar2 = std::operator==(&pHVar5->Literal,".");
    if (bVar2) goto LAB_00417ff2;
  }
  FormatString<char[26],char[46]>
            ((string *)local_58,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"DotToken != ScopeEnd && Token->Literal == \".\"",(char (*) [46])Args_1)
  ;
  pCVar4 = (Char *)std::__cxx11::string::c_str();
  Args_1 = (iterator *)0x6b6;
  DebugAssertionFailed
            (pCVar4,"ProcessObjectMethod",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x6b6);
  std::__cxx11::string::~string((string *)local_58);
LAB_00417ff2:
  msg_1.field_2._8_8_ = msg.field_2._8_8_;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
            ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&msg_1.field_2 + 8));
  bVar2 = std::operator!=((_Self *)((long)&msg_1.field_2 + 8),ScopeEnd);
  if ((!bVar2) ||
     (pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                          ((long)&msg_1.field_2 + 8)), pHVar5->Type != Identifier)) {
    FormatString<char[26],char[70]>
              ((string *)&IdentifierToken,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier",
               (char (*) [70])Args_1);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b9);
    std::__cxx11::string::~string((string *)&IdentifierToken);
  }
  local_98._M_node = (_List_node_base *)msg.field_2._8_8_;
  while( true ) {
    bVar3 = std::operator!=(&local_98,ScopeStart);
    bVar2 = false;
    if (bVar3) {
      pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98);
      bVar2 = pHVar5->Type != Identifier;
    }
    if (!bVar2) break;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_98);
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98);
    if (((pHVar5->Type == ClosingAngleBracket) ||
        (pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98),
        pHVar5->Type == ClosingSquareBracket)) ||
       (pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98),
       pHVar5->Type == ClosingParen)) {
      err.field_2._8_8_ = local_98._M_node;
      local_98._M_node =
           (_List_node_base *)
           Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                     (ScopeStart,ScopeEnd,local_98._M_node);
      bVar2 = std::operator!=(Token,ScopeEnd);
      if (!bVar2) {
        FormatString<char[45]>
                  ((string *)local_c8,(char (*) [45])"Unable to find matching open square bracket.")
        ;
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)&pObjectInfo,this,Token,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessObjectMethod",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x6ca,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8,(char (*) [2])0xc39489,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pObjectInfo
                  );
        std::__cxx11::string::~string((string *)&pObjectInfo);
        std::__cxx11::string::~string((string *)local_c8);
      }
    }
  }
  bVar2 = std::operator==(&local_98,ScopeStart);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98);
    _Obj = FindHLSLObject(this,&pHVar5->Literal);
    if (_Obj == (HLSLObjectInfo *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      ArgsListEndToken._M_node = (_List_node_base *)msg_1.field_2._8_8_;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&ArgsListEndToken);
      bVar2 = std::operator==(&ArgsListEndToken,ScopeEnd);
      if ((bVar2) ||
         (pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&ArgsListEndToken), pHVar5->Type != OpenParen)) {
        this_local._7_1_ = false;
      }
      else {
        iStack_108._M_node = ArgsListEndToken._M_node;
        StubIt.
        super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
        ._M_cur._4_4_ = CountFunctionArguments(this,&stack0xfffffffffffffef8,ScopeEnd);
        bVar2 = std::operator==(&stack0xfffffffffffffef8,ScopeEnd);
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          this_00 = this->m_Converter;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&msg_1.field_2 + 8))
          ;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_160,pcVar6,&local_161);
          FunctionStubHashKey::FunctionStubHashKey
                    (&local_140,&_Obj->GLSLType,&local_160,
                     StubIt.
                     super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                     ._M_cur._4_4_);
          local_118._M_cur =
               (__node_type *)
               std::
               unordered_map<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_Diligent::FunctionStubHashKey::Hasher,_std::equal_to<Diligent::FunctionStubHashKey>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>_>
               ::find(&this_00->m_GLSLStubs,&local_140);
          FunctionStubHashKey::~FunctionStubHashKey(&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          _msg.field_2._8_8_ =
               std::
               unordered_map<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_Diligent::FunctionStubHashKey::Hasher,_std::equal_to<Diligent::FunctionStubHashKey>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>_>
               ::end(&this->m_Converter->m_GLSLStubs);
          bVar2 = std::__detail::operator==
                            (&local_118,
                             (_Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                              *)((long)&_msg.field_2 + 8));
          if (bVar2) {
            pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98);
            pHVar7 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                               ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                                ((long)&msg_1.field_2 + 8));
            FormatString<char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
                      ((string *)local_190,(Diligent *)"Unable to find function stub for ",
                       (char (*) [34])&pHVar5->Literal,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xcca6b6
                       ,(char (*) [2])&pHVar7->Literal,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc1a303
                       ,(char (*) [2])
                        ((long)&StubIt.
                                super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                ._M_cur + 4),(uint *)" args). GLSL object type: ",
                       (char (*) [27])_Obj,in_stack_fffffffffffffab0);
            puVar1 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar8 = std::__cxx11::string::c_str();
              (*(code *)puVar1)(2,uVar8,0);
            }
            std::__cxx11::string::~string((string *)local_190);
            this_local._7_1_ = false;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_200,",",&local_201);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_228,"",&local_229);
            Parsing::HLSLTokenInfo::HLSLTokenInfo
                      (&local_1e0,Comma,&local_200,&local_228,0xffffffffffffffff);
            this_01 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator*
                                (&ArgsListEndToken);
            Parsing::HLSLTokenInfo::operator=(this_01,&local_1e0);
            Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_1e0);
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator((allocator<char> *)&local_229);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator((allocator<char> *)&local_201);
            std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                      (&local_238,(iterator *)((long)&msg.field_2 + 8));
            std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                      (&local_240,&ArgsListEndToken);
            local_248 = (_List_node_base *)
                        std::__cxx11::
                        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                        ::erase(&this->m_Tokens,local_238,local_240);
            std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                      (&local_250,&local_98);
            std::__detail::
            _Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
            ::operator->((_Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                          *)&local_118);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2c0,pcVar6,&local_2c1);
            std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2e8,pcVar6,&local_2e9);
            Parsing::HLSLTokenInfo::HLSLTokenInfo
                      (&local_2a0,Identifier,&local_2c0,&local_2e8,0xffffffffffffffff);
            local_2f8 = (_List_node_base *)
                        std::__cxx11::
                        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                        ::insert(&this->m_Tokens,local_250,&local_2a0);
            Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_2a0);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
            pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_98);
            std::__cxx11::string::operator=((string *)&pHVar5->Delimiter," ");
            std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                      (&local_300,&local_98);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_370,"(",&local_371);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_398,"",&local_399);
            Parsing::HLSLTokenInfo::HLSLTokenInfo
                      (&local_350,OpenParen,&local_370,&local_398,0xffffffffffffffff);
            SwizzleToken = std::__cxx11::
                           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                           ::insert(&this->m_Tokens,local_300,&local_350);
            Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_350);
            std::__cxx11::string::~string((string *)&local_398);
            std::allocator<char>::~allocator((allocator<char> *)&local_399);
            std::__cxx11::string::~string((string *)&local_370);
            std::allocator<char>::~allocator((allocator<char> *)&local_371);
            Token->_M_node = (_List_node_base *)ArgsListEndToken;
            std::__detail::
            _Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
            ::operator->((_Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                          *)&local_118);
            lVar9 = std::__cxx11::string::length();
            if (lVar9 != 0) {
              std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                        (&local_3b8,&stack0xfffffffffffffef8);
              std::__detail::
              _Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
              ::operator->((_Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                            *)&local_118);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_428,pcVar6,&local_429);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_450,"",&local_451);
              Parsing::HLSLTokenInfo::HLSLTokenInfo
                        (&local_408,TextBlock,&local_428,&local_450,0xffffffffffffffff);
              local_3b0._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                   ::insert(&this->m_Tokens,local_3b8,&local_408);
              Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_408);
              std::__cxx11::string::~string((string *)&local_450);
              std::allocator<char>::~allocator((allocator<char> *)&local_451);
              std::__cxx11::string::~string((string *)&local_428);
              std::allocator<char>::~allocator((allocator<char> *)&local_429);
              pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_3b0)
              ;
              std::__cxx11::string::push_back((char)pHVar5 + '\b');
            }
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod(TokenListType::iterator&       Token,
                                                                   const TokenListType::iterator& ScopeStart,
                                                                   const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( ...
    //         ^
    //      DotToken
    auto DotToken = Token;
    VERIFY_EXPR(DotToken != ScopeEnd && Token->Literal == ".");
    auto MethodToken = DotToken;
    ++MethodToken;
    VERIFY_EXPR(MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier);
    // TestText.Sample( ...
    //          ^
    //     MethodToken
    auto IdentifierToken = DotToken;
    // m_Tokens contains dummy node at the beginning, so we can
    // check for ScopeStart to break the loop
    while (IdentifierToken != ScopeStart && IdentifierToken->Type != TokenType::Identifier)
    {
        --IdentifierToken;
        if (IdentifierToken->Type == TokenType::ClosingAngleBracket ||
            IdentifierToken->Type == TokenType::ClosingSquareBracket ||
            IdentifierToken->Type == TokenType::ClosingParen)
        {
            // TestText[idx[0]].Sample( ...
            //                ^
            IdentifierToken = Parsing::FindMatchingBracket(ScopeStart, ScopeEnd, IdentifierToken);
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching open square bracket.");
            // TestText[idx[0]].Sample( ...
            //         ^
        }
    }
    if (IdentifierToken == ScopeStart)
        return false;
    // TestTextArr[2].Sample( ...
    // ^
    // IdentifierToken

    // Try to find identifier
    const auto* pObjectInfo = FindHLSLObject(IdentifierToken->Literal);
    if (pObjectInfo == nullptr)
    {
        return false;
    }
    const auto& ObjectType = pObjectInfo->GLSLType;

    auto ArgsListStartToken = MethodToken;
    ++ArgsListStartToken;

    // TestText.Sample( ...
    //                ^
    //     ArgsListStartToken

    if (ArgsListStartToken == ScopeEnd || ArgsListStartToken->Type != TokenType::OpenParen)
        return false;
    auto   ArgsListEndToken = ArgsListStartToken;
    Uint32 NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);

    if (ArgsListEndToken == ScopeEnd)
        return false;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    //                                               ArgsListEndToken
    auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey(ObjectType, MethodToken->Literal.c_str(), NumArguments));
    if (StubIt == m_Converter.m_GLSLStubs.end())
    {
        LOG_ERROR_MESSAGE("Unable to find function stub for ", IdentifierToken->Literal, ".", MethodToken->Literal, "(", NumArguments, " args). GLSL object type: ", ObjectType);
        return false;
    }

    //            DotToken
    //               V
    // TestTextArr[2].Sample( TestTextArr_sampler, ...
    // ^                    ^
    // IdentifierToken      ArgsListStartToken

    *ArgsListStartToken = TokenInfo(TokenType::Comma, ",");
    // TestTextArr[2].Sample, TestTextArr_sampler, ...
    //               ^      ^
    //           DotToken  ArgsListStartToken

    m_Tokens.erase(DotToken, ArgsListStartToken);
    // TestTextArr[2], TestTextArr_sampler, ...
    // ^
    // IdentifierToken

    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::Identifier, StubIt->second.Name.c_str(), IdentifierToken->Delimiter.c_str()));
    IdentifierToken->Delimiter = " ";
    // FunctionStub TestTextArr[2], TestTextArr_sampler, ...
    //              ^
    //              IdentifierToken


    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::OpenParen, "("));
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //               ^
    //               IdentifierToken

    Token = ArgsListStartToken;
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //                             ^
    //                           Token

    // Nested function calls will be automatically processed:
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, TestTex.Sample(...
    //                             ^
    //                           Token


    // Add swizzling if there is any
    if (StubIt->second.Swizzle.length() > 0)
    {
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    );
        //                                                            ^
        //                                                     ArgsListEndToken

        auto SwizzleToken = m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, StubIt->second.Swizzle.c_str(), ""));
        SwizzleToken->Literal.push_back(static_cast<Char>('0' + pObjectInfo->NumComponents));
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    )_SWIZZLE4;
        //                                                                     ^
        //                                                            ArgsListEndToken
    }
    return true;
}